

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

size_t __thiscall
Potassco::ProgramOptions::DefaultFormat::format
          (DefaultFormat *this,vector<char,_std::allocator<char>_> *buffer,OptionGroup *grp)

{
  long lVar1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  const_iterator in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffc8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x12923d);
  OptionGroup::caption_abi_cxx11_((OptionGroup *)in_RDX._M_current);
  lVar1 = std::__cxx11::string::length();
  __first._M_current = (char *)in_RSI;
  if (lVar1 != 0) {
    OptionGroup::caption_abi_cxx11_((OptionGroup *)in_RDX._M_current);
    std::__cxx11::string::length();
    std::vector<char,_std::allocator<char>_>::reserve
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    uVar3 = 10;
    std::vector<char,_std::allocator<char>_>::push_back
              (in_RSI,(value_type *)in_stack_ffffffffffffff98);
    std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff98);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)in_RSI,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
               in_stack_ffffffffffffff98);
    OptionGroup::caption_abi_cxx11_((OptionGroup *)in_RDX._M_current);
    std::__cxx11::string::begin();
    OptionGroup::caption_abi_cxx11_((OptionGroup *)in_RDX._M_current);
    std::__cxx11::string::end();
    std::vector<char,std::allocator<char>>::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<char,_std::allocator<char>_> *)CONCAT17(uVar3,in_stack_ffffffffffffffe0),
               in_RDI,__first,in_RDX);
    std::vector<char,_std::allocator<char>_>::push_back
              (in_RSI,(value_type *)in_stack_ffffffffffffff98);
    std::vector<char,_std::allocator<char>_>::push_back
              (in_RSI,(value_type *)in_stack_ffffffffffffff98);
    std::vector<char,_std::allocator<char>_>::push_back
              (in_RSI,(value_type *)in_stack_ffffffffffffff98);
  }
  sVar2 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)__first._M_current);
  return sVar2;
}

Assistant:

std::size_t DefaultFormat::format(std::vector<char>& buffer, const OptionGroup& grp) {
	buffer.clear();
	if (grp.caption().length()) {
		buffer.reserve(grp.caption().length() + 4);
		buffer.push_back('\n');
		buffer.insert(buffer.end(), grp.caption().begin(), grp.caption().end());
		buffer.push_back(':');
		buffer.push_back('\n');
		buffer.push_back('\n');
	}
	return buffer.size();
}